

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O1

CaseDefinition *
vkt::pipeline::anon_unknown_0::makeArrayCompositeCaseDefinition
          (CaseDefinition *__return_storage_ptr__,DataType elemType,int size1,int size2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CaseDefinition *pCVar2;
  DataType dataType;
  DataType DVar3;
  long *plVar4;
  undefined8 *puVar5;
  char *pcVar6;
  ostream *poVar7;
  size_t sVar8;
  undefined4 in_register_0000000c;
  size_type *psVar9;
  ulong *puVar10;
  long *plVar11;
  int specConstNdx;
  int numCombinations;
  int idxBegin;
  undefined8 uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int idxEnd;
  int iVar16;
  DataType type;
  string caseName;
  string elemTypeName;
  string padding;
  string accumType;
  string arraySizeDecl;
  string varName;
  ostringstream arrayCtorExpr;
  ostringstream globalCode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  undefined8 local_4b8;
  string local_4b0;
  CaseDefinition *local_490;
  undefined1 local_488 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_470 [2];
  ostream *local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  long *local_428;
  long local_420;
  long local_418;
  undefined8 uStack_410;
  int local_404;
  ulong *local_400;
  long local_3f8;
  ulong local_3f0;
  long lStack_3e8;
  string local_3e0;
  ulong *local_3c0;
  long local_3b8;
  ulong local_3b0 [2];
  long *local_3a0;
  long local_398;
  long local_390;
  long lStack_388;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  long *local_340 [2];
  long local_330 [2];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  ios_base local_138 [264];
  
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e0,"a","",CONCAT44(in_register_0000000c,size2));
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::ostream::operator<<(local_320,3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_4f8,0,(char *)0x0,0xb561c0);
  local_488._0_8_ = local_488 + 0x10;
  psVar9 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar9) {
    local_488._16_8_ = *psVar9;
    aaStack_470[0]._0_8_ = plVar4[3];
  }
  else {
    local_488._16_8_ = *psVar9;
    local_488._0_8_ = (size_type *)*plVar4;
  }
  local_488._8_8_ = plVar4[1];
  *plVar4 = (long)psVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(local_488);
  puVar10 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar10) {
    local_198 = *puVar10;
    uStack_190 = (undefined4)plVar4[3];
    uStack_18c = *(undefined4 *)((long)plVar4 + 0x1c);
    local_1a8 = &local_198;
  }
  else {
    local_198 = *puVar10;
    local_1a8 = (ulong *)*plVar4;
  }
  local_1a0 = plVar4[1];
  *plVar4 = (long)puVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (size1 < 1) {
    local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"");
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_320);
    std::ostream::operator<<(local_320,size1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_320);
    std::ios_base::~ios_base(local_2b0);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_340,0,(char *)0x0,0xb561c0);
    local_3a0 = &local_390;
    plVar11 = plVar4 + 2;
    if ((long *)*plVar4 == plVar11) {
      local_390 = *plVar11;
      lStack_388 = plVar4[3];
    }
    else {
      local_390 = *plVar11;
      local_3a0 = (long *)*plVar4;
    }
    local_398 = plVar4[1];
    *plVar4 = (long)plVar11;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_3a0);
    local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
    puVar10 = (ulong *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_4d8.field_2._M_allocated_capacity = *puVar10;
      local_4d8.field_2._8_8_ = plVar4[3];
    }
    else {
      local_4d8.field_2._M_allocated_capacity = *puVar10;
      local_4d8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_4d8._M_string_length = plVar4[1];
    *plVar4 = (long)puVar10;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
  }
  uVar13 = 0xf;
  if (local_1a8 != &local_198) {
    uVar13 = local_198;
  }
  if (uVar13 < local_4d8._M_string_length + local_1a0) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
      uVar12 = local_4d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_4d8._M_string_length + local_1a0) goto LAB_004a9323;
    lVar15 = local_1a0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_4d8,0,(char *)0x0,(ulong)local_1a8);
    iVar14 = (int)lVar15;
  }
  else {
LAB_004a9323:
    lVar15 = local_1a0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_4d8._M_dataplus._M_p);
    iVar14 = (int)lVar15;
  }
  local_428 = &local_418;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_418 = *plVar4;
    uStack_410 = puVar5[3];
  }
  else {
    local_418 = *plVar4;
    local_428 = (long *)*puVar5;
  }
  local_420 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if (0 < size1) {
    if (local_3a0 != &local_390) {
      operator_delete(local_3a0,local_390 + 1);
    }
    if (local_340[0] != local_330) {
      operator_delete(local_340[0],local_330[0] + 1);
    }
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
    operator_delete((void *)local_488._0_8_,local_488._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  numCombinations = 3;
  if (0 < size1) {
    numCombinations = size1 * 3;
  }
  pcVar6 = glu::getDataTypeName(elemType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,pcVar6,(allocator<char> *)local_320);
  local_490 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  if (0 < numCombinations) {
    specConstNdx = 0;
    local_4b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(CONCAT44(local_4b8._4_4_,
                             (uint)(byte)((byte)(0x777ffbffd >> ((byte)elemType & 0x3f)) |
                                         TYPE_BOOL < elemType)) & 0xffffffff00000001);
    local_404 = numCombinations;
    do {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a8,local_4d8._M_dataplus._M_p,
                          local_4d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_3e0._M_dataplus._M_p,local_3e0._M_string_length);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,specConstNdx);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)local_428,local_420);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_4d8._M_dataplus._M_p,local_4d8._M_string_length);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)local_428,local_420);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"sc0","");
      std::__cxx11::ostringstream::ostringstream(local_320);
      if (size1 < 1) {
        iVar14 = 3;
        composite_case_internal::generateInitializerListWithSpecConstant
                  ((string *)local_488,elemType,SUB81(local_4b8,0),0,3,&local_4b0,specConstNdx);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,(char *)local_488._0_8_,local_488._8_8_);
        if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
          operator_delete((void *)local_488._0_8_,local_488._16_8_ + 1);
        }
      }
      else {
        local_488._0_8_ = local_488 + 0x10;
        local_450 = poVar7;
        std::__cxx11::string::_M_construct((ulong)local_488,'$');
        iVar16 = 3;
        idxBegin = 0;
        do {
          if (iVar16 == 3) {
            local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
            local_4f8._M_string_length = 0;
            local_4f8.field_2._M_local_buf[0] = '\0';
          }
          else {
            std::operator+(&local_4f8,",\n",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_488);
          }
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_320,local_4f8._M_dataplus._M_p,
                              local_4f8._M_string_length);
          pcVar6 = glu::getDataTypeName(elemType);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
          }
          else {
            sVar8 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[",1);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,size1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"](",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,
                            CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                                     local_4f8.field_2._M_local_buf[0]) + 1);
          }
          idxEnd = size1 + idxBegin;
          iVar14 = idxEnd;
          composite_case_internal::generateInitializerListWithSpecConstant
                    (&local_4f8,elemType,SUB81(local_4b8,0),idxBegin,idxEnd,&local_4b0,specConstNdx)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,
                            CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                                     local_4f8.field_2._M_local_buf[0]) + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,")",1);
          numCombinations = local_404;
          iVar16 = iVar16 + -1;
          idxBegin = idxEnd;
        } while (iVar16 != 0);
        poVar7 = local_450;
        if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
          operator_delete((void *)local_488._0_8_,local_488._16_8_ + 1);
          poVar7 = local_450;
        }
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_320);
      std::ios_base::~ios_base(local_2b0);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_448._M_dataplus._M_p,local_448._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,");\n",3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
      specConstNdx = specConstNdx + 1;
    } while (specConstNdx != numCombinations);
  }
  dataType = glu::getDataTypeScalarType(elemType);
  type = TYPE_DOUBLE_MAT2X3;
  if (dataType == TYPE_BOOL) {
    type = TYPE_INVALID;
  }
  pcVar6 = "";
  if (0 < size1) {
    pcVar6 = "array_";
  }
  std::operator+(&local_4f8,pcVar6,&local_4d8);
  pCVar2 = local_490;
  DVar3 = TYPE_INT;
  if (dataType != TYPE_BOOL) {
    DVar3 = dataType;
  }
  pcVar6 = glu::getDataTypeName(DVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,pcVar6,(allocator<char> *)local_320);
  local_4b8 = &(pCVar2->name).field_2;
  (pCVar2->name)._M_dataplus._M_p = (pointer)local_4b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pCVar2,local_4f8._M_dataplus._M_p,
             local_4f8._M_dataplus._M_p + local_4f8._M_string_length);
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"sc0","");
  composite_case_internal::makeSpecConstant
            ((SpecConstant *)local_488,&local_380,dataType,type,iVar14);
  makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
            (&pCVar2->specConstants,(SpecConstant *)local_488);
  local_450 = (ostream *)&pCVar2->specConstants;
  DVar3 = glu::getDataTypeScalarType(elemType);
  if (DVar3 < TYPE_BOOL_VEC2) {
    iVar14 = 4;
    if ((0x888000002U >> ((ulong)DVar3 & 0x3f) & 1) == 0) {
      if ((ulong)DVar3 != 0xe) goto LAB_004a9dc3;
      iVar14 = 8;
    }
  }
  else {
LAB_004a9dc3:
    iVar14 = 0;
  }
  pCVar2->ssboSize = (ulong)(uint)(iVar14 * numCombinations);
  std::operator+(&local_360,"    ",&local_448);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_360);
  local_400 = &local_3f0;
  puVar10 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar10) {
    local_3f0 = *puVar10;
    lStack_3e8 = plVar4[3];
  }
  else {
    local_3f0 = *puVar10;
    local_400 = (ulong *)*plVar4;
  }
  local_3f8 = plVar4[1];
  *plVar4 = (long)puVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::ostream::operator<<(local_320,numCombinations);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  uVar13 = 0xf;
  if (local_400 != &local_3f0) {
    uVar13 = local_3f0;
  }
  if (uVar13 < (ulong)(local_3b8 + local_3f8)) {
    uVar13 = 0xf;
    if (local_3c0 != local_3b0) {
      uVar13 = local_3b0[0];
    }
    if ((ulong)(local_3b8 + local_3f8) <= uVar13) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_3c0,0,(char *)0x0,(ulong)local_400);
      goto LAB_004a9b2b;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_400,(ulong)local_3c0);
LAB_004a9b2b:
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  psVar9 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_4b0.field_2._M_allocated_capacity = *psVar9;
    local_4b0.field_2._8_8_ = puVar5[3];
  }
  else {
    local_4b0.field_2._M_allocated_capacity = *psVar9;
    local_4b0._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_4b0._M_string_length = puVar5[1];
  *puVar5 = psVar9;
  puVar5[1] = 0;
  *(undefined1 *)psVar9 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_4b0);
  paVar1 = &(pCVar2->ssboCode).field_2;
  (pCVar2->ssboCode)._M_dataplus._M_p = (pointer)paVar1;
  psVar9 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar9) {
    lVar15 = plVar4[3];
    paVar1->_M_allocated_capacity = *psVar9;
    *(long *)((long)&(pCVar2->ssboCode).field_2 + 8) = lVar15;
  }
  else {
    (pCVar2->ssboCode)._M_dataplus._M_p = (pointer)*plVar4;
    (pCVar2->ssboCode).field_2._M_allocated_capacity = *psVar9;
  }
  (pCVar2->ssboCode)._M_string_length = plVar4[1];
  *plVar4 = (long)psVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::stringbuf::str();
  composite_case_internal::generateShaderChecksumComputationCode
            (&pCVar2->mainCode,elemType,&local_3e0,&local_448,3,size1,numCombinations);
  composite_case_internal::computeExpectedValues
            (&pCVar2->expectedValues,type,dataType,numCombinations);
  pCVar2->requirements = (uint)(dataType == TYPE_DOUBLE) << 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  if (local_3c0 != local_3b0) {
    operator_delete(local_3c0,local_3b0[0] + 1);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400,local_3f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._8_8_ != aaStack_470) {
    operator_delete((void *)local_488._8_8_,aaStack_470[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if (local_428 != &local_418) {
    operator_delete(local_428,local_418 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  return pCVar2;
}

Assistant:

CaseDefinition makeArrayCompositeCaseDefinition (const glu::DataType elemType, const int size1, const int size2 = 0)
{
	using namespace composite_case_internal;

	DE_ASSERT(size1 > 0);

	const bool        isArrayOfArray  = (size2 > 0);
	const std::string varName		  = "a";
	const std::string arraySizeDecl   = "[" + de::toString(size1) + "]" + (isArrayOfArray ? "[" + de::toString(size2) + "]" : "");
	const int         numCombinations = (isArrayOfArray ? size1 * size2 : size1);
	const std::string elemTypeName    (glu::getDataTypeName(elemType));

	std::ostringstream globalCode;
	{
		// Create several arrays with specialization constant inserted in different positions.
		for (int combNdx = 0; combNdx < numCombinations; ++combNdx)
			globalCode << elemTypeName << " " << varName << combNdx << arraySizeDecl << " = "
					   << elemTypeName << arraySizeDecl << "(" << generateArrayConstructorString(elemType, size1, size2, "sc0", combNdx) << ");\n";
	}

	const glu::DataType scalarType = glu::getDataTypeScalarType(elemType);
	const bool          isBoolData = (scalarType == glu::TYPE_BOOL);
	const int           specValue  = (isBoolData ? 0 : 19);
	const std::string   caseName   = (isArrayOfArray ? "array_" : "") + elemTypeName;
	const std::string   accumType  = (glu::getDataTypeName(isBoolData ? glu::TYPE_INT : scalarType));

	const CaseDefinition def =
	{
		caseName,
		makeVector(makeSpecConstant("sc0", 1u, scalarType, specValue)),
		static_cast<VkDeviceSize>(getDataTypeScalarSizeBytes(elemType) * numCombinations),
		"    " + accumType + " result[" + de::toString(numCombinations) + "];\n",
		globalCode.str(),
		generateShaderChecksumComputationCode(elemType, varName, accumType, size1, size2, numCombinations),
		computeExpectedValues(specValue, scalarType, numCombinations),
		(scalarType == glu::TYPE_DOUBLE ? (FeatureFlags)FEATURE_SHADER_FLOAT_64 : (FeatureFlags)0),
	};
	return def;
}